

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool ts_parser__can_reuse_first_leaf
                (TSParser *self,TSStateId state,Subtree tree,TableEntry *table_entry)

{
  TSLexMode TVar1;
  _Bool _Var2;
  TSSymbol TVar3;
  TSStateId TVar4;
  Length LVar5;
  byte local_59;
  uint32_t local_48;
  TSLexMode leaf_lex_mode;
  TSStateId leaf_state;
  TSSymbol leaf_symbol;
  TSLexMode current_lex_mode;
  TableEntry *table_entry_local;
  TSStateId state_local;
  TSParser *self_local;
  Subtree tree_local;
  
  TVar1 = self->language->lex_modes[state];
  TVar3 = ts_subtree_leaf_symbol(tree);
  TVar4 = ts_subtree_leaf_parse_state(tree);
  if ((self->language->lex_modes[TVar4] == TVar1) &&
     ((TVar3 != self->language->keyword_capture_token ||
      ((_Var2 = ts_subtree_is_keyword(tree), !_Var2 &&
       (TVar4 = ts_subtree_parse_state(tree), TVar4 == state)))))) {
    return true;
  }
  LVar5 = ts_subtree_size(tree);
  local_48 = LVar5.bytes;
  if ((local_48 == 0) && (TVar3 != 0)) {
    tree_local.data.parse_state._1_1_ = 0;
  }
  else {
    leaf_lex_mode.external_lex_state = TVar1.external_lex_state;
    local_59 = 0;
    if (leaf_lex_mode.external_lex_state == 0) {
      local_59 = table_entry->is_reusable;
    }
    tree_local.data.parse_state._1_1_ = local_59 & 1;
  }
  return (_Bool)tree_local.data.parse_state._1_1_;
}

Assistant:

static bool ts_parser__can_reuse_first_leaf(TSParser *self, TSStateId state, Subtree tree,
                                            TableEntry *table_entry) {
  TSLexMode current_lex_mode = self->language->lex_modes[state];
  TSSymbol leaf_symbol = ts_subtree_leaf_symbol(tree);
  TSStateId leaf_state = ts_subtree_leaf_parse_state(tree);
  TSLexMode leaf_lex_mode = self->language->lex_modes[leaf_state];

  // If the token was created in a state with the same set of lookaheads, it is reusable.
  if (memcmp(&leaf_lex_mode, &current_lex_mode, sizeof(TSLexMode)) == 0 &&
      (leaf_symbol != self->language->keyword_capture_token ||
       (!ts_subtree_is_keyword(tree) && ts_subtree_parse_state(tree) == state))) return true;

  // Empty tokens are not reusable in states with different lookaheads.
  if (ts_subtree_size(tree).bytes == 0 && leaf_symbol != ts_builtin_sym_end) return false;

  // If the current state allows external tokens or other tokens that conflict with this
  // token, this token is not reusable.
  return current_lex_mode.external_lex_state == 0 && table_entry->is_reusable;
}